

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

bool __thiscall QIconModeViewBase::filterDropEvent(QIconModeViewBase *this,QDropEvent *e)

{
  ulong uVar1;
  QSize QVar2;
  QWidget *this_00;
  bool bVar3;
  int iVar4;
  int iVar5;
  ItemFlags IVar6;
  QListView *pQVar7;
  QPoint QVar8;
  QPoint QVar9;
  QListViewPrivate *pQVar10;
  ulong uVar11;
  ulong uVar12;
  Representation RVar13;
  Representation RVar14;
  Representation RVar15;
  long lVar16;
  Representation RVar17;
  QModelIndex *pQVar18;
  long in_FS_OFFSET;
  QRect local_80;
  QPoint local_70;
  undefined1 local_68 [12];
  Representation RStack_5c;
  QArrayDataPointer<QModelIndex> local_58;
  QPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = (QListView *)QDropEvent::source();
  if (pQVar7 == (this->super_QCommonListViewBase).qq) {
    QVar2 = (this->super_QCommonListViewBase).contentsSize;
    iVar4 = (*(this->super_QCommonListViewBase)._vptr_QCommonListViewBase[0xd])(this);
    iVar5 = (*(this->super_QCommonListViewBase)._vptr_QCommonListViewBase[0xe])(this);
    local_58.d = *(Data **)(e + 0x10);
    local_58.ptr = *(QModelIndex **)(e + 0x18);
    QVar8 = QPointF::toPoint((QPointF *)&local_58);
    RVar17.m_i = iVar4 + QVar8.xp.m_i.m_i;
    RVar15.m_i = QVar8.yp.m_i.m_i + iVar5;
    local_40.yp.m_i = RVar15.m_i;
    local_40.xp.m_i = RVar17.m_i;
    bVar3 = QWidget::acceptDrops((QWidget *)(this->super_QCommonListViewBase).qq);
    if (!bVar3) {
LAB_0051888b:
      pQVar10 = (this->super_QCommonListViewBase).dd;
      local_70 = (pQVar10->super_QAbstractItemViewPrivate).pressedPosition;
      if (pQVar10->movement == Snap) {
        QVar8 = snapToGrid(this,&local_40);
        QVar9 = snapToGrid(this,&local_70);
        uVar11 = (ulong)(uint)(QVar8.xp.m_i.m_i - QVar9.xp.m_i) |
                 (long)QVar8 - ((ulong)QVar9 & 0xffffffff00000000) & 0xffffffff00000000;
      }
      else {
        uVar11 = CONCAT44(RVar15.m_i - local_70.yp.m_i,RVar17.m_i - local_70.xp.m_i);
      }
      local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
      QItemSelectionModel::selectedIndexes();
      pQVar18 = local_58.ptr;
      for (lVar16 = local_58.size * 0x18; lVar16 != 0; lVar16 = lVar16 + -0x18) {
        stack0xffffffffffffffa0 = &DAT_aaaaaaaaaaaaaaaa;
        local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        _local_68 = QListViewPrivate::rectForIndex((this->super_QCommonListViewBase).dd,pQVar18);
        pQVar10 = (this->super_QCommonListViewBase).dd;
        this_00 = (pQVar10->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                  viewport;
        local_80 = QListViewPrivate::mapToViewport(pQVar10,(QRect *)local_68,false);
        QWidget::update(this_00,&local_80);
        uVar1 = local_68._0_8_ + uVar11;
        uVar12 = uVar1 & 0xffffffff |
                 local_68._0_8_ + (uVar11 & 0xffffffff00000000) & 0xffffffff00000000;
        local_80.x1.m_i = (int)uVar12;
        local_80.y1.m_i = (int)(uVar12 >> 0x20);
        bVar3 = QWidget::isRightToLeft((QWidget *)(this->super_QCommonListViewBase).qq);
        if (bVar3) {
          iVar4 = QListViewPrivate::flipX((this->super_QCommonListViewBase).dd,(int)uVar1);
          local_80.x1.m_i = ~local_68._8_4_ + iVar4 + local_68._0_4_;
        }
        moveItem(this,pQVar18->r,(QPoint *)&local_80);
        QAbstractItemView::update((QAbstractItemView *)(this->super_QCommonListViewBase).qq,pQVar18)
        ;
        pQVar18 = pQVar18 + 1;
      }
      QAbstractItemViewPrivate::stopAutoScroll
                (&((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate);
      QList<QModelIndex>::clear(&this->draggedItems);
      QListViewPrivate::emitIndexesMoved
                ((this->super_QCommonListViewBase).dd,(QModelIndexList *)&local_58);
      pQVar10 = (this->super_QCommonListViewBase).dd;
      bVar3 = true;
      (pQVar10->super_QAbstractItemViewPrivate).dropEventMoved = true;
      e[0xc] = (QDropEvent)0x1;
      iVar4 = (this->super_QCommonListViewBase).contentsSize.wd.m_i;
      iVar5 = (this->super_QCommonListViewBase).contentsSize.ht.m_i;
      RVar13 = QVar2.wd.m_i;
      RVar14 = QVar2.ht.m_i;
      if (iVar5 != RVar14.m_i || iVar4 != RVar13.m_i) {
        if (iVar4 <= RVar13.m_i || iVar5 <= RVar14.m_i) {
          updateContentsSize(this);
          pQVar10 = (this->super_QCommonListViewBase).dd;
        }
        (**(code **)(**(long **)&(pQVar10->super_QAbstractItemViewPrivate).
                                 super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                 super_QWidgetPrivate.field_0x8 + 0x268))();
      }
      QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_58);
      goto LAB_00518aba;
    }
    local_68._4_4_ = RVar15.m_i;
    local_68._0_4_ = RVar17.m_i;
    local_68._8_4_ = RVar17.m_i;
    RStack_5c.m_i = RVar15.m_i;
    (*(this->super_QCommonListViewBase)._vptr_QCommonListViewBase[7])(&local_58,this);
    lVar16 = local_58.size * 0x18;
    pQVar18 = local_58.ptr;
    do {
      if (lVar16 == 0) {
        QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_58);
        goto LAB_0051888b;
      }
      IVar6 = QModelIndex::flags(pQVar18);
      pQVar18 = pQVar18 + 1;
      lVar16 = lVar16 + -0x18;
    } while ((~(uint)IVar6.super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
                     super_QFlagsStorage<Qt::ItemFlag>.i & 0x28) != 0);
    QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_58);
  }
  bVar3 = false;
LAB_00518aba:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QIconModeViewBase::filterDropEvent(QDropEvent *e)
{
    if (e->source() != qq)
        return false;

    const QSize contents = contentsSize;
    QPoint offset(horizontalOffset(), verticalOffset());
    QPoint end = e->position().toPoint() + offset;
    if (qq->acceptDrops()) {
        const Qt::ItemFlags dropableFlags = Qt::ItemIsDropEnabled|Qt::ItemIsEnabled;
        const QList<QModelIndex> &dropIndices = intersectingSet(QRect(end, QSize(1, 1)));
        for (const QModelIndex &index : dropIndices)
            if ((index.flags() & dropableFlags) == dropableFlags)
                return false;
    }
    QPoint start = dd->pressedPosition;
    QPoint delta = (dd->movement == QListView::Snap ? snapToGrid(end) - snapToGrid(start) : end - start);
    const QList<QModelIndex> indexes = dd->selectionModel->selectedIndexes();
    for (const auto &index : indexes) {
        QRect rect = dd->rectForIndex(index);
        viewport()->update(dd->mapToViewport(rect, false));
        QPoint dest = rect.topLeft() + delta;
        if (qq->isRightToLeft())
            dest.setX(dd->flipX(dest.x()) - rect.width());
        moveItem(index.row(), dest);
        qq->update(index);
    }
    dd->stopAutoScroll();
    draggedItems.clear();
    dd->emitIndexesMoved(indexes);
    // do not delete item on internal move, see filterStartDrag()
    dd->dropEventMoved = true;
    e->accept(); // we have handled the event
    // if the size has not grown, we need to check if it has shrunk
    if (contentsSize != contents) {
        if ((contentsSize.width() <= contents.width()
            || contentsSize.height() <= contents.height())) {
                updateContentsSize();
        }
        dd->viewUpdateGeometries();
    }
    return true;
}